

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp analyze_app(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  
  psVar2 = analyze_list(ctx,x,depth,0);
  psVar3 = (psVar2->value).type.name;
  if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x1c)) {
    psVar4 = (psVar2->value).type.cpl;
    while ((((((ulong)psVar4 & 3) == 0 && (psVar4->tag == 6)) &&
            (psVar3 = (psVar3->value).type.cpl, ((ulong)psVar3 & 3) == 0)) && (psVar3->tag == 6))) {
      psVar1 = (psVar4->value).type.name;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x1c)) {
        (psVar1->value).flonum = (psVar3->value).flonum;
      }
      psVar4 = (psVar4->value).type.cpl;
    }
  }
  return psVar2;
}

Assistant:

static sexp analyze_app (sexp ctx, sexp x, int depth) {
  sexp p, res, tmp;
  res = analyze_list(ctx, x, depth, 0);
  if (sexp_lambdap(sexp_car(res))) {       /* fill in lambda names */
    p=sexp_lambda_params(sexp_car(res));
    for (tmp=sexp_cdr(res); sexp_pairp(tmp)&&sexp_pairp(p); tmp=sexp_cdr(tmp), p=sexp_cdr(p))
      if (sexp_lambdap(sexp_car(tmp)))
        sexp_lambda_name(sexp_car(tmp)) = sexp_car(p);
  }
  return res;
}